

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

void Convert16To8Plane(uint16_t *src_y,int src_stride_y,uint8_t *dst_y,int dst_stride_y,int scale,
                      int width,int height)

{
  int iVar1;
  uint in_ECX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined4 in_R8D;
  uint in_R9D;
  _func_void_uint16_t_ptr_uint8_t_ptr_int_int *Convert16To8Row;
  int y;
  code *pcVar2;
  int local_28;
  uint local_24;
  uint local_1c;
  long local_18;
  uint local_c;
  long local_8;
  
  pcVar2 = Convert16To8Row_C;
  local_1c = in_ECX;
  local_18 = in_RDX;
  if ((int)Convert16To8Row < 0) {
    Convert16To8Row._0_4_ = -(int)Convert16To8Row;
    local_18 = in_RDX + (int)(((int)Convert16To8Row + -1) * in_ECX);
    local_1c = -in_ECX;
  }
  local_24 = in_R9D;
  local_c = in_ESI;
  if ((in_ESI == in_R9D) && (local_1c == in_R9D)) {
    local_24 = (int)Convert16To8Row * in_R9D;
    Convert16To8Row._0_4_ = 1;
    local_1c = 0;
    local_c = 0;
  }
  iVar1 = libyuv::TestCpuFlag(0);
  if ((iVar1 != 0) && (pcVar2 = Convert16To8Row_Any_SSSE3, (local_24 & 0xf) == 0)) {
    pcVar2 = Convert16To8Row_SSSE3;
  }
  iVar1 = libyuv::TestCpuFlag(0);
  if ((iVar1 != 0) && (pcVar2 = Convert16To8Row_Any_AVX2, (local_24 & 0x1f) == 0)) {
    pcVar2 = Convert16To8Row_AVX2;
  }
  local_8 = in_RDI;
  for (local_28 = 0; local_28 < (int)Convert16To8Row; local_28 = local_28 + 1) {
    (*pcVar2)(local_8,local_18,in_R8D,local_24);
    local_8 = local_8 + (long)(int)local_c * 2;
    local_18 = local_18 + (int)local_1c;
  }
  return;
}

Assistant:

LIBYUV_API
void Convert16To8Plane(const uint16_t* src_y,
                       int src_stride_y,
                       uint8_t* dst_y,
                       int dst_stride_y,
                       int scale,  // 16384 for 10 bits
                       int width,
                       int height) {
  int y;
  void (*Convert16To8Row)(const uint16_t* src_y, uint8_t* dst_y, int scale,
                          int width) = Convert16To8Row_C;

  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_y = dst_y + (height - 1) * dst_stride_y;
    dst_stride_y = -dst_stride_y;
  }
  // Coalesce rows.
  if (src_stride_y == width && dst_stride_y == width) {
    width *= height;
    height = 1;
    src_stride_y = dst_stride_y = 0;
  }
#if defined(HAS_CONVERT16TO8ROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    Convert16To8Row = Convert16To8Row_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      Convert16To8Row = Convert16To8Row_SSSE3;
    }
  }
#endif
#if defined(HAS_CONVERT16TO8ROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    Convert16To8Row = Convert16To8Row_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      Convert16To8Row = Convert16To8Row_AVX2;
    }
  }
#endif

  // Convert plane
  for (y = 0; y < height; ++y) {
    Convert16To8Row(src_y, dst_y, scale, width);
    src_y += src_stride_y;
    dst_y += dst_stride_y;
  }
}